

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O3

bool __thiscall
S2PolylineSimplifier::TargetDisc(S2PolylineSimplifier *this,S2Point *p,S1ChordAngle r)

{
  double margin;
  double p_00;
  byte bVar1;
  S1Interval SVar2;
  S1Interval target;
  S1Interval local_30;
  S1Interval local_20;
  
  margin = GetSemiwidth(this,p,r,-1);
  bVar1 = 1;
  if (margin < 3.141592653589793) {
    if (0.0 <= margin) {
      p_00 = GetAngle(this,p);
      local_30 = S1Interval::FromPoint(p_00);
      local_20 = S1Interval::Expanded(&local_30,margin);
      SVar2 = S1Interval::Intersection(&this->window_,&local_20);
      *(Vector2_d *)(this->window_).bounds_.c_ = SVar2.bounds_.c_;
      bVar1 = -(SVar2.bounds_.c_[0] != 3.141592653589793) |
              -(SVar2.bounds_.c_[1] != -3.141592653589793);
    }
    else {
      (this->window_).bounds_.c_[0] = 3.141592653589793;
      (this->window_).bounds_.c_[1] = -3.141592653589793;
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool S2PolylineSimplifier::TargetDisc(const S2Point& p, S1ChordAngle r) {
  // Shrink the target interval by the maximum error from all sources.  This
  // guarantees that the output edge will intersect the given disc.
  double semiwidth = GetSemiwidth(p, r, -1 /*round down*/);
  if (semiwidth >= M_PI) {
    // The target disc contains "src", so there is nothing to do.
    return true;
  }
  if (semiwidth < 0) {
    window_ = S1Interval::Empty();
    return false;
  }
  // Otherwise compute the angle interval corresponding to the target disc and
  // intersect it with the current window.
  double center = GetAngle(p);
  S1Interval target = S1Interval::FromPoint(center).Expanded(semiwidth);
  window_ = window_.Intersection(target);
  return !window_.is_empty();
}